

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.h
# Opt level: O0

void llvm::deallocate_buffer(void *Ptr,size_t Size,size_t Alignment)

{
  size_t Alignment_local;
  size_t Size_local;
  void *Ptr_local;
  
  operator_delete(Ptr,Size,Alignment);
  return;
}

Assistant:

inline void deallocate_buffer(void *Ptr, size_t Size, size_t Alignment) {
  ::operator delete(Ptr
#ifdef __cpp_sized_deallocation
                    ,
                    Size
#endif
#ifdef __cpp_aligned_new
                    ,
                    std::align_val_t(Alignment)
#endif
  );
}